

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

BOOL MayHaveSideEffectOnNode
               (ParseNode *pnode,ParseNode *pnodeSE,ByteCodeGenerator *byteCodeGenerator)

{
  OpCode OVar1;
  ParseNode *this;
  uint uVar2;
  ParseNodeUni *pPVar3;
  SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  Type *ppPVar5;
  ParseNodeCall *pPVar6;
  ParseNodeBin *pPVar7;
  ParseNodeTri *pPVar8;
  Type pSVar9;
  bool bVar10;
  ParseNodePtr pPVar11;
  BOOL BVar12;
  SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> local_40;
  
  if (pnode->nop == knopComputedName) {
    pPVar3 = ParseNode::AsParseNodeUni(pnode);
    pnode = pPVar3->pnode1;
  }
  BVar12 = 0;
  if (pnode->nop == knopName) {
    local_40.allocator = byteCodeGenerator->alloc;
    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count =
         0;
    BVar12 = 0;
    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&local_40;
    pSVar4 = (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
             new<Memory::ArenaAllocator>(0x10,local_40.allocator,0x366bee);
    *(ParseNode **)
     &(pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount =
         pnodeSE;
    (pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next =
         local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next;
    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count =
         local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
         count + 1;
    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar4;
    if (pSVar4 != &local_40) {
      do {
        ppPVar5 = SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Head
                            (&local_40.
                              super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>);
        this = *ppPVar5;
        SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                  (&local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>,
                   local_40.allocator);
        uVar2 = ParseNode::Grfnop((uint)this->nop);
        bVar10 = false;
        if ((uVar2 & 2) == 0) {
          if ((uVar2 & 0x20) == 0) {
            if ((uVar2 & 4) == 0) {
              if ((uVar2 & 8) == 0) {
                OVar1 = this->nop;
                if (OVar1 < knopQmark) {
                  if ((OVar1 == knopCall) || (OVar1 == knopNew)) {
                    pPVar6 = ParseNode::AsParseNodeCall(this);
                    pSVar4 = (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                             new<Memory::ArenaAllocator>(0x10,local_40.allocator,0x366bee);
                    *(ParseNodePtr *)
                     &(pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).
                      super_RealCount = pPVar6->pnodeTarget;
                    (pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).
                    super_SListNodeBase<Memory::ArenaAllocator>.next =
                         local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                         super_SListNodeBase<Memory::ArenaAllocator>.next;
                    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                    super_RealCount.count =
                         local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                         super_RealCount.count + 1;
                    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar4;
                    pPVar6 = ParseNode::AsParseNodeCall(this);
                    if (pPVar6->pnodeArgs != (ParseNodePtr)0x0) {
                      pPVar6 = ParseNode::AsParseNodeCall(this);
                      pSVar4 = (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                               new<Memory::ArenaAllocator>(0x10,local_40.allocator,0x366bee);
                      goto LAB_00806709;
                    }
                  }
                }
                else {
                  bVar10 = true;
                  if (OVar1 == knopList) goto LAB_00806721;
                  if (OVar1 == knopQmark) {
                    pPVar8 = ParseNode::AsParseNodeTri(this);
                    pSVar9 = (Type)new<Memory::ArenaAllocator>(0x10,local_40.allocator,0x366bee);
                    pSVar9[1].next = (Type)pPVar8->pnode1;
                    pSVar9->next = local_40.
                                   super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                                   super_SListNodeBase<Memory::ArenaAllocator>.next;
                    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                    super_RealCount.count =
                         local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                         super_RealCount.count + 1;
                    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                    super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar9;
                    pSVar4 = (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                             new<Memory::ArenaAllocator>(0x10,local_40.allocator,0x366bee);
                    *(ParseNodePtr *)
                     &(pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).
                      super_RealCount = pPVar8->pnode2;
                    (pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).
                    super_SListNodeBase<Memory::ArenaAllocator>.next =
                         local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                         super_SListNodeBase<Memory::ArenaAllocator>.next;
                    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                    super_RealCount.count =
                         local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                         super_RealCount.count + 1;
                    local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar4;
                    pSVar4 = (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                             new<Memory::ArenaAllocator>(0x10,local_40.allocator,0x366bee);
                    pPVar11 = pPVar8->pnode3;
                    goto LAB_0080670d;
                  }
                }
              }
              else {
                pPVar7 = ParseNode::AsParseNodeBin(this);
                pSVar4 = (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                         new<Memory::ArenaAllocator>(0x10,local_40.allocator,0x366bee);
                *(ParseNodePtr *)
                 &(pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).
                  super_RealCount = pPVar7->pnode1;
                (pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListNodeBase<Memory::ArenaAllocator>.next =
                     local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
                local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                super_RealCount.count =
                     local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                     super_RealCount.count + 1;
                local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar4;
                pPVar7 = ParseNode::AsParseNodeBin(this);
                if (pPVar7->pnode2 != (ParseNodePtr)0x0) {
                  pPVar6 = (ParseNodeCall *)ParseNode::AsParseNodeBin(this);
                  pSVar4 = (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                           new<Memory::ArenaAllocator>(0x10,local_40.allocator,0x366bee);
LAB_00806709:
                  pPVar11 = pPVar6->pnodeArgs;
LAB_0080670d:
                  *(ParseNodePtr *)
                   &(pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).
                    super_RealCount = pPVar11;
                  (pSVar4->super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>).
                  super_SListNodeBase<Memory::ArenaAllocator>.next =
                       local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                       super_SListNodeBase<Memory::ArenaAllocator>.next;
                  local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                  super_RealCount.count =
                       local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                       super_RealCount.count + 1;
                  local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
                  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar4;
                }
              }
            }
            else {
              if (this->nop == knopTempRef) goto LAB_00806721;
              pPVar3 = ParseNode::AsParseNodeUni(this);
              if (pPVar3->pnode1 != (ParseNodePtr)0x0) {
                pPVar3 = ParseNode::AsParseNodeUni(this);
                pSVar4 = (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                         new<Memory::ArenaAllocator>(0x10,local_40.allocator,0x366bee);
                pPVar11 = pPVar3->pnode1;
                goto LAB_0080670d;
              }
            }
            bVar10 = false;
          }
          else {
            bVar10 = true;
          }
        }
LAB_00806721:
        if (bVar10) {
          BVar12 = 1;
          goto LAB_008067cc;
        }
      } while ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
               local_40.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next != &local_40);
      BVar12 = 0;
    }
LAB_008067cc:
    SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::~SList(&local_40);
  }
  return BVar12;
}

Assistant:

BOOL MayHaveSideEffectOnNode(ParseNode *pnode, ParseNode *pnodeSE, ByteCodeGenerator *byteCodeGenerator)
{
    // Try to determine whether pnodeSE (SE = side effect) may kill the named var represented by pnode.

    if (pnode->nop == knopComputedName)
    {
        pnode = pnode->AsParseNodeUni()->pnode1;
    }

    if (pnode->nop != knopName)
    {
        // Only investigating named vars here.
        return false;
    }

    ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
    SList<ParseNode*> pNodeSEStack(alloc);

    pNodeSEStack.Push(pnodeSE);

    // A pnodeSE can have children that can cause a side effect on pnode. A stack is used to check
    // pnodeSE and all potential pnodeSE children that could cause a side effect on pnode. When a
    // child pnodeSE can cause a side effect on pnode, immediately return true. Otherwise continue
    // checking children of pnodeSE until none exist
    while (!pNodeSEStack.Empty())
    {
        ParseNode *currPnodeSE = pNodeSEStack.Pop();
        uint fnop = ParseNode::Grfnop(currPnodeSE->nop);

        if (fnop & fnopLeaf)
        {
            // pnodeSE is a leaf and can't kill anything.
            continue;
        }
        else if (fnop & fnopAsg)
        {
            // pnodeSE is an assignment (=, ++, +=, etc.)
            // Trying to examine the LHS of pnodeSE caused small perf regressions,
            // maybe because of code layout or some other subtle effect.
            return true;
        }
        else if (fnop & fnopUni)
        {
            // pnodeSE is a unary op, so recurse to the source (if present - e.g., [] may have no opnd).
            if (currPnodeSE->nop == knopTempRef)
            {
                continue;
            }
            else if (currPnodeSE->AsParseNodeUni()->pnode1)
            {
                pNodeSEStack.Push(currPnodeSE->AsParseNodeUni()->pnode1);
            }
        }
        else if (fnop & fnopBin)
        {
            // currPnodeSE is a binary (or ternary) op, so check sources (if present).

            pNodeSEStack.Push(currPnodeSE->AsParseNodeBin()->pnode1);
            
            if (currPnodeSE->AsParseNodeBin()->pnode2)
            {
                pNodeSEStack.Push(currPnodeSE->AsParseNodeBin()->pnode2);
            }
        }
        else if (currPnodeSE->nop == knopQmark)
        {
            ParseNodeTri * pnodeTriSE = currPnodeSE->AsParseNodeTri();

            pNodeSEStack.Push(pnodeTriSE->pnode1);
            pNodeSEStack.Push(pnodeTriSE->pnode2);
            pNodeSEStack.Push(pnodeTriSE->pnode3);
        }
        else if (currPnodeSE->nop == knopCall || currPnodeSE->nop == knopNew)
        {
            pNodeSEStack.Push(currPnodeSE->AsParseNodeCall()->pnodeTarget);

            if (currPnodeSE->AsParseNodeCall()->pnodeArgs)
            {
                pNodeSEStack.Push(currPnodeSE->AsParseNodeCall()->pnodeArgs);
            }
        }
        else if (currPnodeSE->nop == knopList)
        {
            return true;
        }
    }

    return false;
}